

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::Array2D<pbrt::Point2<float>_>::Array2D
          (Array2D<pbrt::Point2<float>_> *this,Bounds2i *extent,Allocator allocator)

{
  Point2<float> *pPVar1;
  Tuple2<pbrt::Point2,_int> TVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  TVar2 = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMin.super_Tuple2<pbrt::Point2,_int> =
       (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  (this->extent).pMax.super_Tuple2<pbrt::Point2,_int> = TVar2;
  (this->allocator).memoryResource = allocator.memoryResource;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (extent->pMax).super_Tuple2<pbrt::Point2,_int>;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (extent->pMin).super_Tuple2<pbrt::Point2,_int>;
  auVar7 = vpsubd_avx(auVar6,auVar7);
  auVar6 = vpshufd_avx(auVar7,0x55);
  auVar6 = vpmulld_avx(auVar6,auVar7);
  uVar5 = auVar6._0_4_;
  if (uVar5 == 0) {
    this->values = (Point2<float> *)0x0;
  }
  else {
    iVar3 = (*(allocator.memoryResource)->_vptr_memory_resource[2])
                      (allocator.memoryResource,(long)(int)uVar5 << 3,4);
    this->values = (Point2<float> *)CONCAT44(extraout_var,iVar3);
    if (0 < (int)uVar5) {
      uVar4 = 0;
      do {
        pPVar1 = this->values;
        pPVar1[uVar4].super_Tuple2<pbrt::Point2,_float>.x = 0.0;
        pPVar1[uVar4].super_Tuple2<pbrt::Point2,_float>.y = 0.0;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
  }
  return;
}

Assistant:

Array2D(const Bounds2i &extent, Allocator allocator = {})
        : extent(extent), allocator(allocator) {
        int n = extent.Area();
        values = allocator.allocate_object<T>(n);
        for (int i = 0; i < n; ++i)
            allocator.construct(values + i);
    }